

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_GL.c
# Opt level: O2

_Bool setup_pixel_format(SWindowData_X11 *window_data_x11)

{
  GLXContext p_Var1;
  long lVar2;
  undefined1 *puVar3;
  GLint *pGVar4;
  GLint glxAttribs [21];
  
  puVar3 = &DAT_00105b30;
  pGVar4 = glxAttribs;
  for (lVar2 = 0x54; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(undefined1 *)pGVar4 = *puVar3;
    puVar3 = puVar3 + 1;
    pGVar4 = (GLint *)((long)pGVar4 + 1);
  }
  lVar2 = glXChooseVisual(window_data_x11->display,window_data_x11->screen);
  if (lVar2 == 0) {
    fwrite("Could not create correct visual window.\n",0x28,1,_stderr);
    XCloseDisplay(window_data_x11->display);
  }
  else {
    p_Var1 = (GLXContext)glXCreateContext(window_data_x11->display,lVar2,0,1);
    window_data_x11->context = p_Var1;
  }
  return lVar2 != 0;
}

Assistant:

bool
setup_pixel_format(SWindowData_X11 *window_data_x11) {
    GLint glxAttribs[] = {
        GLX_RGBA,
        GLX_DOUBLEBUFFER,
        GLX_DEPTH_SIZE,     24,
        GLX_STENCIL_SIZE,   8,
        GLX_RED_SIZE,       8,
        GLX_GREEN_SIZE,     8,
        GLX_BLUE_SIZE,      8,
        GLX_DEPTH_SIZE,     24,
        GLX_STENCIL_SIZE,   8,
        GLX_SAMPLE_BUFFERS, 0,
        GLX_SAMPLES,        0,
        None
    };

    XVisualInfo* visualInfo = glXChooseVisual(window_data_x11->display, window_data_x11->screen, glxAttribs);
    if (visualInfo == 0) {
        fprintf(stderr, "Could not create correct visual window.\n");
        XCloseDisplay(window_data_x11->display);
        return false;
    }
    window_data_x11->context = glXCreateContext(window_data_x11->display, visualInfo, NULL, GL_TRUE);

    return true;
}